

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_blend.cpp
# Opt level: O0

void V_AddPlayerBlend(player_t *CPlayer,float *blend,float maxinvalpha,int maxpainblend)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  MetaClass *this;
  float fVar5;
  float local_50;
  FName local_3c;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_38;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_34;
  PalEntry painFlash;
  PalEntry color;
  AInventory *item;
  int cnt;
  int maxpainblend_local;
  float maxinvalpha_local;
  float *blend_local;
  player_t *CPlayer_local;
  
  _painFlash = TObjPtr::operator_cast_to_AInventory_
                         ((TObjPtr *)&(CPlayer->mo->super_AActor).Inventory);
  cnt = (int)maxinvalpha;
  for (; _painFlash != (AInventory *)0x0;
      _painFlash = TObjPtr::operator_cast_to_AInventory_
                             ((TObjPtr *)&(_painFlash->super_AActor).Inventory)) {
    local_34.field_0 =
         (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)
         AInventory::CallGetBlend(_painFlash);
    if (local_34._3_1_ != 0) {
      V_AddBlend((float)((uint)local_34 >> 0x10 & 0xff) / 255.0,
                 (float)((uint)local_34 >> 8 & 0xff) / 255.0,(float)((uint)local_34 & 0xff) / 255.0,
                 (float)(byte)local_34._3_1_ / 255.0,blend);
      if ((float)cnt < (float)(byte)local_34._3_1_ / 255.0) {
        cnt = (int)((float)(byte)local_34._3_1_ / 255.0);
      }
    }
  }
  if (CPlayer->bonuscount != 0) {
    iVar3 = CPlayer->bonuscount;
    fVar5 = FFloatCVar::operator_cast_to_float(&pickup_fade_scalar);
    iVar3 = (int)((float)(iVar3 << 3) * fVar5);
    if (iVar3 < 0x81) {
      local_50 = (float)iVar3 / 255.0;
    }
    else {
      local_50 = 0.5;
    }
    V_AddBlend((float)(gameinfo.pickupcolor >> 0x10 & 0xff) / 255.0,
               (float)(gameinfo.pickupcolor >> 8 & 0xff) / 255.0,
               (float)(gameinfo.pickupcolor & 0xff) / 255.0,local_50,blend);
  }
  local_38 = (anon_union_4_2_12391d7c_for_PalEntry_0)
             *(anon_union_4_2_12391d7c_for_PalEntry_0 *)&(CPlayer->mo->DamageFade).field_0.field_0;
  this = APlayerPawn::GetClass(CPlayer->mo);
  FName::FName(&local_3c,&(CPlayer->mo->super_AActor).DamageTypeReceived.super_FName);
  PClassPlayerPawn::GetPainFlash(this,&local_3c,(PalEntry *)&local_38.field_0);
  if (local_38.field_0.a != 0) {
    iVar3 = MIN<int>(0x71,(int)(CPlayer->damagecount * (uint)local_38.field_0.a) / 0xff);
    bVar1 = DamageToAlpha[iVar3];
    fVar5 = FFloatCVar::operator_cast_to_float(&blood_fade_scalar);
    item._4_4_ = (int)((float)bVar1 * fVar5);
    if (item._4_4_ != 0) {
      if (maxpainblend < item._4_4_) {
        item._4_4_ = maxpainblend;
      }
      V_AddBlend((float)(local_38.d >> 0x10 & 0xff) / 255.0,(float)(local_38.d >> 8 & 0xff) / 255.0,
                 (float)(local_38.d & 0xff) / 255.0,(float)item._4_4_ / 255.0,blend);
    }
  }
  if (CPlayer->poisoncount != 0) {
    iVar3 = MIN<int>(CPlayer->poisoncount,0x40);
    uVar4 = FIntCVar::operator_cast_to_int(&paletteflash);
    if ((uVar4 & 2) == 0) {
      V_AddBlend(0.04,0.2571,0.0,(float)iVar3 / 93.25714,blend);
    }
    else {
      V_AddBlend(0.17254902,0.36078432,0.14117648,(float)(iVar3 + 7 >> 3) * 0.1,blend);
    }
  }
  if (CPlayer->hazardcount != 0) {
    uVar4 = FIntCVar::operator_cast_to_int(&paletteflash);
    if ((uVar4 & 8) == 0) {
      iVar3 = MIN<int>(CPlayer->hazardcount / 8,0x40);
      V_AddBlend(0.0,0.2571,0.0,(float)iVar3 / 93.25714,blend);
    }
    else if ((0x230 < CPlayer->hazardcount) || ((CPlayer->hazardcount & 8U) != 0)) {
      V_AddBlend(0.0,1.0,0.0,0.125,blend);
    }
  }
  bVar2 = FName::operator==(&(CPlayer->mo->super_AActor).DamageType.super_FName,NAME_Ice);
  if (bVar2) {
    uVar4 = FIntCVar::operator_cast_to_int(&paletteflash);
    if ((uVar4 & 4) == 0) {
      V_AddBlend(0.25,0.25,0.853,0.4,blend);
    }
    else {
      V_AddBlend(0.0,0.0,0.8784314,0.5,blend);
    }
  }
  if ((float)cnt < blend[3]) {
    blend[3] = (float)cnt;
  }
  return;
}

Assistant:

void V_AddPlayerBlend (player_t *CPlayer, float blend[4], float maxinvalpha, int maxpainblend)
{
	int cnt;

	// [RH] All powerups can affect the screen blending now
	for (AInventory *item = CPlayer->mo->Inventory; item != NULL; item = item->Inventory)
	{
		PalEntry color = item->CallGetBlend ();
		if (color.a != 0)
		{
			V_AddBlend (color.r/255.f, color.g/255.f, color.b/255.f, color.a/255.f, blend);
			if (color.a/255.f > maxinvalpha) maxinvalpha = color.a/255.f;
		}
	}
	if (CPlayer->bonuscount)
	{
		cnt = CPlayer->bonuscount << 3;

		// [SP] Allow player to tone down intensity of pickup flash.
		cnt = (int)( cnt * pickup_fade_scalar );
		
		V_AddBlend (RPART(gameinfo.pickupcolor)/255.f, GPART(gameinfo.pickupcolor)/255.f, 
					BPART(gameinfo.pickupcolor)/255.f, cnt > 128 ? 0.5f : cnt / 255.f, blend);
	}

	PalEntry painFlash = CPlayer->mo->DamageFade;
	CPlayer->mo->GetClass()->GetPainFlash(CPlayer->mo->DamageTypeReceived, &painFlash);

	if (painFlash.a != 0)
	{
		cnt = DamageToAlpha[MIN (113, CPlayer->damagecount * painFlash.a / 255)];

		// [BC] Allow users to tone down the intensity of the blood on the screen.
		cnt = (int)( cnt * blood_fade_scalar );

		if (cnt)
		{
			if (cnt > maxpainblend)
				cnt = maxpainblend;

			V_AddBlend (painFlash.r / 255.f, painFlash.g / 255.f, painFlash.b / 255.f, cnt / 255.f, blend);
		}
	}

	// Unlike Doom, I did not have any utility source to look at to find the
	// exact numbers to use here, so I've had to guess by looking at how they
	// affect the white color in Hexen's palette and picking an alpha value
	// that seems reasonable.
	// [Gez] The exact values could be obtained by looking how they affect
	// each color channel in Hexen's palette.

	if (CPlayer->poisoncount)
	{
		cnt = MIN (CPlayer->poisoncount, 64);
		if (paletteflash & PF_POISON)
		{
			V_AddBlend(44/255.f, 92/255.f, 36/255.f, ((cnt + 7) >> 3) * 0.1f, blend);
		}
		else
		{
			V_AddBlend (0.04f, 0.2571f, 0.f, cnt/93.2571428571f, blend);
		}

	}

	if (CPlayer->hazardcount)
	{
		if (paletteflash & PF_HAZARD)
		{
			if (CPlayer->hazardcount > 16*TICRATE || (CPlayer->hazardcount & 8))
			{
				V_AddBlend (0.f, 1.f, 0.f, 0.125f, blend);
			}
		}
		else
		{
			cnt= MIN(CPlayer->hazardcount/8, 64);
			V_AddBlend (0.f, 0.2571f, 0.f, cnt/93.2571428571f, blend);
		}
	}

	if (CPlayer->mo->DamageType == NAME_Ice)
	{
		if (paletteflash & PF_ICE)
		{
			V_AddBlend(0.f, 0.f, 224/255.f, 0.5f, blend);
		}
		else
		{
			V_AddBlend (0.25f, 0.25f, 0.853f, 0.4f, blend);
		}		
	}

	// cap opacity if desired
	if (blend[3] > maxinvalpha) blend[3] = maxinvalpha;
}